

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O3

REF_STATUS ref_grid_orient_twod(REF_GRID ref_grid)

{
  REF_NODE ref_node;
  REF_CELL pRVar1;
  REF_INT *pRVar2;
  REF_STATUS RVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  undefined8 uVar7;
  long lVar8;
  char *pcVar9;
  REF_INT cell;
  int iVar10;
  REF_BOOL valid;
  REF_INT nodes [27];
  int local_ac;
  REF_INT local_a8 [30];
  
  ref_node = ref_grid->node;
  pRVar1 = ref_grid->cell[3];
  if (0 < pRVar1->max) {
    cell = 0;
    do {
      RVar3 = ref_cell_nodes(pRVar1,cell,local_a8);
      if (RVar3 == 0) {
        uVar4 = ref_node_tri_twod_orientation(ref_node,local_a8,&local_ac);
        if (uVar4 != 0) {
          pcVar9 = "valid";
          uVar7 = 0x30f;
          goto LAB_00152b70;
        }
        if ((local_ac == 0) && (iVar10 = pRVar1->node_per, 0 < iVar10)) {
          pRVar2 = pRVar1->c2n;
          iVar5 = -1;
          lVar8 = 0;
          do {
            pRVar2[(long)pRVar1->size_per * (long)cell + lVar8] = local_a8[iVar10 + iVar5];
            iVar10 = pRVar1->node_per;
            lVar8 = lVar8 + 1;
            iVar5 = iVar5 + -1;
          } while ((int)lVar8 < iVar10);
        }
      }
      cell = cell + 1;
    } while (cell < pRVar1->max);
  }
  pRVar1 = ref_grid->cell[6];
  if (0 < pRVar1->max) {
    iVar10 = 0;
    do {
      RVar3 = ref_cell_nodes(pRVar1,iVar10,local_a8);
      if (RVar3 == 0) {
        uVar4 = ref_node_tri_twod_orientation(ref_node,local_a8,&local_ac);
        if (uVar4 != 0) {
          pcVar9 = "valid";
          uVar7 = 0x31a;
          goto LAB_00152b70;
        }
        if ((local_ac == 0) && (iVar5 = pRVar1->node_per, 0 < iVar5)) {
          pRVar2 = pRVar1->c2n;
          iVar6 = -1;
          lVar8 = 0;
          do {
            pRVar2[(long)pRVar1->size_per * (long)iVar10 + lVar8] = local_a8[iVar5 + iVar6];
            iVar5 = pRVar1->node_per;
            lVar8 = lVar8 + 1;
            iVar6 = iVar6 + -1;
          } while ((int)lVar8 < iVar5);
        }
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < pRVar1->max);
  }
  pRVar1 = ref_grid->cell[0];
  if (0 < pRVar1->max) {
    iVar10 = 0;
    do {
      RVar3 = ref_cell_nodes(pRVar1,iVar10,local_a8);
      if (RVar3 == 0) {
        uVar4 = ref_grid_orient_edg(ref_grid,local_a8);
        if (uVar4 != 0) {
          pcVar9 = "orient_edge";
          uVar7 = 0x325;
LAB_00152b70:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 uVar7,"ref_grid_orient_twod",(ulong)uVar4,pcVar9);
          return uVar4;
        }
        if (0 < pRVar1->node_per) {
          pRVar2 = pRVar1->c2n;
          lVar8 = 0;
          do {
            pRVar2[(long)pRVar1->size_per * (long)iVar10 + lVar8] = local_a8[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 < pRVar1->node_per);
        }
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < pRVar1->max);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_grid_orient_twod(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell;
  REF_INT cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL valid;
  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_node_tri_twod_orientation(ref_node, nodes, &valid), "valid");
    if (!valid) {
      each_ref_cell_cell_node(ref_cell, cell_node) {
        ref_cell_c2n(ref_cell, cell_node, cell) =
            nodes[ref_cell_node_per(ref_cell) - 1 - cell_node];
      }
    }
  }
  ref_cell = ref_grid_qua(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    /* uses tri formed from first three nodes of quad for orientation */
    RSS(ref_node_tri_twod_orientation(ref_node, nodes, &valid), "valid");
    if (!valid) {
      each_ref_cell_cell_node(ref_cell, cell_node) {
        ref_cell_c2n(ref_cell, cell_node, cell) =
            nodes[ref_cell_node_per(ref_cell) - 1 - cell_node];
      }
    }
  }
  /* orient edge after tri and quad sorted to use them as reference */
  ref_cell = ref_grid_edg(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_grid_orient_edg(ref_grid, nodes), "orient_edge");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      ref_cell_c2n(ref_cell, cell_node, cell) = nodes[cell_node];
    }
  }
  return REF_SUCCESS;
}